

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

double __thiscall
GuidedMeshNormalFiltering::getSigmaS
          (GuidedMeshNormalFiltering *this,double multiple,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *centroid,TriMesh *mesh)

{
  double dVar1;
  double dVar2;
  pointer pVVar3;
  mesh_ptr pPVar4;
  ulong uVar5;
  FaceHandle start;
  double dVar6;
  double dVar7;
  double dVar8;
  FaceIter FVar9;
  FaceIter FVar10;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  local_a0;
  undefined1 local_88 [8];
  FaceFaceIter ff_it;
  undefined1 local_50 [8];
  FaceIter f_it;
  double local_38;
  
  FVar9 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  uVar5 = FVar9._8_8_;
  _local_50 = FVar9;
  FVar10 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  local_38 = 0.0;
  f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  f_it.skip_bits_ = 0;
  if (FVar9.hnd_.super_BaseHandle.idx_.super_BaseHandle !=
      (BaseHandle)FVar10.hnd_.super_BaseHandle.idx_ || FVar9.mesh_ != FVar10.mesh_) {
    f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
    f_it.skip_bits_ = 0;
    local_38 = 0.0;
    do {
      start.super_BaseHandle.idx_ = SUB84(uVar5,0);
      pVVar3 = (centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ =
           pVVar3[(int)start.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[0];
      dVar1 = pVVar3[(int)start.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[1];
      dVar2 = pVVar3[(int)start.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[2];
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::GenericCirculatorT
                ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)local_88,(mesh_ref)mesh,start,false);
      while ((ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
             (((int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
               ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
              (ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_ == 0))))) {
        ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
             (BaseHandle)
             OpenMesh::Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
             ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                          *)local_88);
        pVVar3 = (centroid->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar6 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[0] -
                (double)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_;
        dVar7 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[1] - dVar1;
        dVar8 = pVVar3[(int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                            super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[2] - dVar2;
        f_it._8_8_ = (double)f_it._8_8_ + SQRT(dVar8 * dVar8 + dVar6 * dVar6 + dVar7 * dVar7);
        local_38 = local_38 + 1.0;
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
        ::operator++(&local_a0,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)local_88,0);
      }
      pPVar4 = f_it.mesh_;
      f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_50._8_4_.super_BaseHandle + 1);
      if ((ulong)pPVar4 >> 0x20 != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_50);
      }
      FVar9 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
      uVar5 = (ulong)(uint)f_it.mesh_._0_4_;
    } while (f_it.mesh_._0_4_ != (BaseHandle)FVar9.hnd_.super_BaseHandle.idx_ ||
             local_50 != (undefined1  [8])FVar9.mesh_);
  }
  return ((double)f_it._8_8_ * multiple) / local_38;
}

Assistant:

double GuidedMeshNormalFiltering::getSigmaS(double multiple, std::vector<TriMesh::Point> &centroid, TriMesh &mesh)
{
    double sigma_s = 0.0, num = 0.0;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Point fi = centroid[f_it->idx()];
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(*f_it); ff_it.is_valid(); ff_it++)
        {
            TriMesh::Point fj = centroid[ff_it->idx()];
            sigma_s += (fj - fi).length();
            num++;
        }
    }
    return sigma_s * multiple / num;
}